

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpCbranch::TypeOpCbranch(TypeOpCbranch *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpCbranch *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"goto",&local_39);
  TypeOp::TypeOp(&this->super_TypeOp,t,CPUI_CBRANCH,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOp)._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084adf8;
  (this->super_TypeOp).opflags = 0x20812;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehavior::OpBehavior(this_00,CPUI_CBRANCH,false,true);
  (this->super_TypeOp).behave = this_00;
  return;
}

Assistant:

TypeOpCbranch::TypeOpCbranch(TypeFactory *t) : TypeOp(t,CPUI_CBRANCH,"goto")

{
  opflags = (PcodeOp::special|PcodeOp::branch|PcodeOp::coderef|PcodeOp::nocollapse);
  behave = new OpBehavior(CPUI_CBRANCH,false,true); // Dummy behavior
}